

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CaseStatement *stmt)

{
  pointer pIVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  bool bVar4;
  long lVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  pointer pIVar6;
  pair<const_slang::ast::Statement_*,_bool> pVar7;
  DataFlowState finalState;
  type initialState;
  DataFlowState *local_368;
  DataFlowState local_350;
  DataFlowState local_2b0;
  DataFlowState local_210;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (stmt->expr,stmt->expr,(DataFlowAnalysis *)this);
  pVar7 = ast::CaseStatement::getKnownBranch(stmt,&(this->super_FlowAnalysisBase).evalContext);
  local_368 = &this->state;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&local_210.assigned,(Base *)local_368);
  local_210.reachable = (this->state).reachable;
  DataFlowAnalysis::unreachableState((DataFlowAnalysis *)this);
  sVar2 = (stmt->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pIVar6 = (stmt->items)._M_ptr;
    pIVar1 = pIVar6 + sVar2;
    do {
      if ((((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (pVar7.first == (pIVar6->stmt).ptr)) {
        DataFlowAnalysis::copyState(&local_350,(DataFlowAnalysis *)this,&local_210);
        setState(this,&local_350);
        if (local_350.assigned.
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
            (pointer)local_350.assigned.
                     super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                     firstElement) {
          operator_delete(local_350.assigned.
                          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                          .data_);
        }
      }
      else {
        setUnreachable(this);
      }
      sVar2 = (pIVar6->expressions)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        ppEVar3 = (pIVar6->expressions)._M_ptr;
        lVar5 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar3 + lVar5);
          ast::Expression::
          visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
                    (this_00,this_00,(DataFlowAnalysis *)this);
          lVar5 = lVar5 + 8;
        } while (sVar2 << 3 != lVar5);
      }
      ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
                ((pIVar6->stmt).ptr,(DataFlowAnalysis *)this);
      DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_2b0,local_368);
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar1);
  }
  bVar4 = FlowAnalysisBase::isFullyCovered(&this->super_FlowAnalysisBase,stmt);
  if (stmt->defaultCase == (Statement *)0x0) {
    local_368 = &local_210;
    if (bVar4 || ((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_0062abb1;
  }
  else {
    if ((byte)(bVar4 | pVar7.second & pVar7.first != stmt->defaultCase) == 1) {
      setUnreachable(this);
    }
    else {
      DataFlowAnalysis::copyState(&local_170,(DataFlowAnalysis *)this,&local_210);
      setState(this,&local_170);
      if (local_170.assigned.
          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
          (pointer)local_170.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   firstElement) {
        operator_delete(local_170.assigned.
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .data_);
      }
    }
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (stmt->defaultCase,(DataFlowAnalysis *)this);
  }
  DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_2b0,local_368);
LAB_0062abb1:
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&local_d0.assigned,(Base *)&local_2b0);
  local_d0.reachable = local_2b0.reachable;
  setState(this,&local_d0);
  if (local_d0.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_d0.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_d0.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  if (local_2b0.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_2b0.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_2b0.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  if (local_210.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_210.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_210.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  return;
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }